

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmSourceGroup *pcVar3;
  bool bVar4;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  string *inName;
  size_type sVar5;
  pointer ppcVar6;
  pointer this_00;
  string linkName4;
  string linkName3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string local_c8;
  string local_a8;
  string local_88;
  string *local_68;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_60;
  cmExtraEclipseCDT4Generator *local_48;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_40;
  cmSourceGroup *local_38;
  
  this_00 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (this_00 !=
      (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_88.field_2;
    local_68 = linkName;
    local_48 = this;
    local_40 = sourceGroups;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar2 = (local_68->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + local_68->_M_string_length);
      std::__cxx11::string::append((char *)&local_a8);
      cmSourceGroup::GetFullName(this_00);
      std::__cxx11::string::append((char *)&local_a8);
      if (local_a8._M_string_length != 0) {
        sVar5 = 0;
        do {
          if (local_a8._M_dataplus._M_p[sVar5] == '\\') {
            local_a8._M_dataplus._M_p[sVar5] = '/';
          }
          sVar5 = sVar5 + 1;
        } while (local_a8._M_string_length != sVar5);
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"virtual:/virtual","");
      AppendLinkedResource(xml,&local_a8,&local_c8,VirtualFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      sourceGroups_00 = cmSourceGroup::GetGroupChildren(this_00);
      if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        WriteGroups(local_48,sourceGroups_00,local_68,xml);
      }
      local_38 = this_00;
      __x = cmSourceGroup::GetSourceFiles(this_00);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                (&local_60,__x);
      for (ppcVar6 = local_60.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppcVar6 !=
          local_60.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
        inName = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar6);
        bVar4 = cmsys::SystemTools::FileIsDirectory(inName);
        if (!bVar4) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          std::__cxx11::string::append((char *)&local_c8);
          cmsys::SystemTools::GetFilenameName(&local_88,inName);
          std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (inName->_M_dataplus)._M_p;
          local_88._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar2,pcVar2 + inName->_M_string_length);
          AppendLinkedResource(xml,&local_c8,&local_88,LinkToFile);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_60.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar3 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      this_00 = pcVar3 + 1;
    } while (this_00 !=
             (local_40->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (std::vector<cmSourceGroup>::const_iterator sgIt = sourceGroups.begin();
       sgIt != sourceGroups.end(); ++sgIt) {
    std::string linkName3 = linkName;
    linkName3 += "/";
    linkName3 += sgIt->GetFullName();

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    this->AppendLinkedResource(xml, linkName3, "virtual:/virtual",
                               VirtualFolder);
    std::vector<cmSourceGroup> const& children = sgIt->GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
    for (std::vector<const cmSourceFile*>::const_iterator fileIt =
           sFiles.begin();
         fileIt != sFiles.end(); ++fileIt) {
      std::string const& fullPath = (*fileIt)->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 = linkName3;
        linkName4 += "/";
        linkName4 += cmSystemTools::GetFilenameName(fullPath);
        this->AppendLinkedResource(xml, linkName4,
                                   this->GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}